

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bswap.c
# Opt level: O0

void mpt_bswap_80(long len,mpt_float80 *val)

{
  uint local_3c;
  uint pos;
  uint8_t *ptr;
  uint8_t tmp [10];
  long i;
  mpt_float80 *val_local;
  long len_local;
  
  tmp[2] = '\0';
  tmp[3] = '\0';
  tmp[4] = '\0';
  tmp[5] = '\0';
  tmp[6] = '\0';
  tmp[7] = '\0';
  tmp[8] = '\0';
  tmp[9] = '\0';
  i = (long)val;
  for (; (long)tmp._2_8_ < len; tmp._2_8_ = tmp._2_8_ + 1) {
    for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
      *(undefined1 *)((long)&ptr + (ulong)local_3c + 6) = *(undefined1 *)(i + (ulong)local_3c);
    }
    for (local_3c = 0; local_3c < 10; local_3c = local_3c + 1) {
      *(uint8_t *)(i + (ulong)local_3c) = tmp[1 - (ulong)local_3c];
    }
    i = i + 10;
  }
  return;
}

Assistant:

extern void mpt_bswap_80(long len, MPT_STRUCT(float80) *val)
{
	long i;
	for (i = 0; i < len; ++i) {
		uint8_t tmp[sizeof(*val)], *ptr = (uint8_t *) val++;
		unsigned pos;
		for (pos = 0; pos < sizeof(tmp); pos++) {
			tmp[pos] = ptr[pos];
		}
		for (pos = 0; pos < sizeof(tmp); pos++) {
			ptr[pos] = tmp[sizeof(tmp) - 1 - pos];
		}
	}
}